

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_Chase(Task *__return_storage_ptr__,TaskDatabase *tasks)

{
  mapped_type *pmVar1;
  Task chasePosition;
  Task chaseSight;
  Task chaseHeading;
  key_type local_119c;
  string local_1198;
  Task local_1178;
  Task local_e00;
  Task local_a88;
  Task local_710;
  Task local_398;
  
  local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1198,"chase","");
  Task::Task(__return_storage_ptr__,&local_1198,Abstract);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
    operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->identifier = Chase;
  create_ChaseSight();
  create_ChaseLastKnownPosition();
  create_ChaseLastKnownHeading();
  Task::Task(&local_710,&local_e00);
  TaskDatabase::addTask(tasks,ChaseSight,&local_710);
  Task::~Task(&local_710);
  Task::Task(&local_a88,&local_1178);
  TaskDatabase::addTask(tasks,ChaseLastKnownPosition,&local_a88);
  Task::~Task(&local_a88);
  local_119c = Chase;
  pmVar1 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&tasks->abstractTaskImplementations,&local_119c);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(pmVar1,&local_e00);
  local_119c = Chase;
  pmVar1 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&tasks->abstractTaskImplementations,&local_119c);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(pmVar1,&local_1178);
  Task::~Task(&local_398);
  Task::~Task(&local_1178);
  Task::~Task(&local_e00);
  return __return_storage_ptr__;
}

Assistant:

Task create_Chase(TaskDatabase& tasks)
	{
		Task chase {"chase", TaskType::Abstract};
		chase.identifier = TaskIdentifier::Chase;

		auto chaseSight = create_ChaseSight();
		auto chasePosition = create_ChaseLastKnownPosition();
		auto chaseHeading = create_ChaseLastKnownHeading();

		tasks.addTask(TaskIdentifier::ChaseSight, chaseSight);
		tasks.addTask(TaskIdentifier::ChaseLastKnownPosition, chasePosition);
		//tasks.addTask(TaskIdentifier::ChaseLastKnownHeading, chaseHeading);

		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseSight);
		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chasePosition);
		//tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseHeading);

		return chase;		
	}